

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_BrepEdge * __thiscall
ON_ObjectArray<ON_BrepEdge>::Realloc
          (ON_ObjectArray<ON_BrepEdge> *this,ON_BrepEdge *ptr,int capacity)

{
  ON_BrepEdge *pOVar1;
  int i;
  long lVar2;
  ON_BrepEdge *pOVar3;
  
  pOVar1 = (ON_BrepEdge *)onrealloc(ptr,(long)capacity * 0x88);
  if (((ptr != (ON_BrepEdge *)0x0) && (pOVar1 != (ON_BrepEdge *)0x0)) && (pOVar1 != ptr)) {
    pOVar3 = pOVar1;
    for (lVar2 = 0; lVar2 < (this->super_ON_ClassArray<ON_BrepEdge>).m_count; lVar2 = lVar2 + 1) {
      (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[5])(pOVar3);
      pOVar3 = pOVar3 + 1;
    }
  }
  return pOVar1;
}

Assistant:

T* ON_ObjectArray<T>::Realloc(T* ptr,int capacity)
{
  T* reptr = (T*)onrealloc(ptr,capacity*sizeof(T));
  if ( ptr && reptr && reptr != ptr )
  {
    // The "this->" in this->m_count and this->m_a 
    // are needed for gcc 4 to compile.
    int i;
    for ( i = 0; i < this->m_count; i++ )
    {
      reptr[i].MemoryRelocate();
    }
  }
  return reptr;
}